

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O2

void __thiscall SimpleLoggerMgr::enableOnlyOneDisplayer(SimpleLoggerMgr *this)

{
  _Hash_node_base _Var1;
  undefined4 uVar2;
  __node_base *p_Var3;
  bool bVar4;
  unique_lock<std::mutex> l;
  
  std::unique_lock<std::mutex>::unique_lock(&l,&this->loggersLock);
  p_Var3 = &(this->loggers)._M_h._M_before_begin;
  bVar4 = false;
  while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
    _Var1._M_nxt = p_Var3[1]._M_nxt;
    if (_Var1._M_nxt != (_Hash_node_base *)0x0) {
      uVar2 = 0xffffffff;
      if (((!bVar4) && (uVar2 = 4, *(int *)((long)&_Var1._M_nxt[0x48]._M_nxt + 4) < 4)) &&
         ((*(byte *)((long)&(_Var1._M_nxt[7]._M_nxt[-3]._M_nxt)->_M_nxt +
                    (long)&_Var1._M_nxt[0xb]._M_nxt) & 5) == 0)) {
        LOCK();
        *(undefined4 *)((long)&_Var1._M_nxt[0x48]._M_nxt + 4) = 4;
        UNLOCK();
      }
      LOCK();
      *(undefined4 *)&_Var1._M_nxt[0x49]._M_nxt = uVar2;
      UNLOCK();
      bVar4 = true;
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&l);
  return;
}

Assistant:

void SimpleLoggerMgr::enableOnlyOneDisplayer() {
    bool marked = false;
    std::unique_lock<std::mutex> l(loggersLock);
    for (auto& entry: loggers) {
        SimpleLogger* logger = entry;
        if (!logger) continue;
        if (!marked) {
            // The first logger: enable display
            if (logger->getLogLevel() < 4) {
                logger->setLogLevel(4);
            }
            logger->setDispLevel(4);
            marked = true;
        } else {
            // The others: disable display
            logger->setDispLevel(-1);
        }
    }
}